

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecmult_impl.h
# Opt level: O0

void secp256k1_ecmult_table_get_ge(secp256k1_ge *r,secp256k1_ge *pre,int n,int w)

{
  undefined4 in_ECX;
  int in_EDX;
  secp256k1_fe *in_RSI;
  void *in_RDI;
  
  secp256k1_ecmult_table_verify(0,0x1339d1);
  if (in_EDX < 1) {
    memcpy(in_RDI,(void *)((long)in_RSI + (long)((-1 - in_EDX) / 2) * 0x68),0x68);
    secp256k1_fe_negate_unchecked(in_RSI,(secp256k1_fe *)CONCAT44(in_EDX,in_ECX),0);
  }
  else {
    memcpy(in_RDI,(void *)((long)in_RSI + (long)((in_EDX + -1) / 2) * 0x68),0x68);
  }
  return;
}

Assistant:

SECP256K1_INLINE static void secp256k1_ecmult_table_get_ge(secp256k1_ge *r, const secp256k1_ge *pre, int n, int w) {
    secp256k1_ecmult_table_verify(n,w);
    if (n > 0) {
        *r = pre[(n-1)/2];
    } else {
        *r = pre[(-n-1)/2];
        secp256k1_fe_negate(&(r->y), &(r->y), 1);
    }
}